

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationGeometryInteractionTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::FeedbackPrimitiveTypeCase::getNumTessellatedPrimitives
          (FeedbackPrimitiveTypeCase *this)

{
  int iVar1;
  int tessellationLevel;
  FeedbackPrimitiveTypeCase *this_local;
  
  if (this->m_tessellationPointMode == TESSELLATION_POINTMODE_OFF) {
    if (this->m_tessellationOutput == TESSELLATION_OUT_TRIANGLES) {
      iVar1 = getTriangleNumOutputPrimitives(3);
      return iVar1;
    }
    if (this->m_tessellationOutput == TESSELLATION_OUT_QUADS) {
      return 0x12;
    }
    if (this->m_tessellationOutput == TESSELLATION_OUT_ISOLINES) {
      return 9;
    }
  }
  else if (this->m_tessellationPointMode == TESSELLATION_POINTMODE_ON) {
    if (this->m_tessellationOutput == TESSELLATION_OUT_TRIANGLES) {
      iVar1 = getTriangleNumOutputPrimitivesPoints(3);
      return iVar1;
    }
    if (this->m_tessellationOutput == TESSELLATION_OUT_QUADS) {
      return 0x10;
    }
    if (this->m_tessellationOutput == TESSELLATION_OUT_ISOLINES) {
      return 0xc;
    }
  }
  return -1;
}

Assistant:

int FeedbackPrimitiveTypeCase::getNumTessellatedPrimitives (void) const
{
	const int tessellationLevel = 3;

	if (m_tessellationPointMode == TESSELLATION_POINTMODE_OFF)
	{
		if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
			return getTriangleNumOutputPrimitives(tessellationLevel);
		else if (m_tessellationOutput == TESSELLATION_OUT_QUADS)
			return tessellationLevel * tessellationLevel * 2; // tessellated as triangles
		else if (m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
			return tessellationLevel * tessellationLevel;
	}
	else if (m_tessellationPointMode == TESSELLATION_POINTMODE_ON)
	{
		if (m_tessellationOutput == TESSELLATION_OUT_TRIANGLES)
			return getTriangleNumOutputPrimitivesPoints(tessellationLevel);
		else if (m_tessellationOutput == TESSELLATION_OUT_QUADS)
			return (tessellationLevel + 1) * (tessellationLevel + 1);
		else if (m_tessellationOutput == TESSELLATION_OUT_ISOLINES)
			return tessellationLevel * (tessellationLevel + 1);
	}

	DE_ASSERT(false);
	return -1;
}